

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::lsd_announce(torrent *this)

{
  byte bVar1;
  uint uVar2;
  element_type *peVar3;
  ushort uVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar6;
  anon_class_16_2_3fe4823c f;
  int port;
  unique_lock<std::mutex> local_30;
  
  uVar6 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if ((((uint)uVar6 >> 0x1a & 1) == 0) && ((this->field_0x5cc & 0x40) != 0)) {
    bVar1 = this->field_0x5c0;
    if ((bVar1 & 8) == 0) {
      if ((bVar1 & 2) == 0) {
        return;
      }
      if (0 < (((this->super_torrent_hot_members).m_torrent_file.
                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_files).m_piece_length) {
        return;
      }
    }
    else {
      if ((bVar1 & 2) == 0) {
        return;
      }
      peVar3 = (this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((0 < (peVar3->m_files).m_piece_length) && (((peVar3->m_flags).m_val & 2) != 0)) {
        return;
      }
    }
    if ((char)this->field_0x5cc < '\0') {
      iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x2e])();
      local_30._M_device = (mutex_type *)(CONCAT44(extraout_var,iVar5) + 0x438);
      local_30._M_owns = false;
      ::std::unique_lock<std::mutex>::lock(&local_30);
      local_30._M_owns = true;
      uVar2 = *(uint *)(CONCAT44(extraout_var,iVar5) + 0x428);
      ::std::unique_lock<std::mutex>::~unique_lock(&local_30);
      if ((uVar2 >> 0x17 & 1) == 0) {
        return;
      }
      uVar6 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
    }
    if (((uVar6 & 0x18000000) == 0) &&
       (iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x3d])(), (char)iVar5 != '\0')) {
      uVar4 = (**(code **)((long)(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                                 _vptr_session_logger +
                          (ulong)(*(uint *)&this->field_0x5dd >> 0x16 & 8) + 0x100))();
      local_30._M_device = (mutex_type *)CONCAT44(local_30._M_device._4_4_,(uint)uVar4);
      f.port = (int *)&local_30;
      f.this = this;
      info_hash_t::for_each<libtorrent::aux::torrent::lsd_announce()::__0>
                (&((this->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_info_hash,f);
    }
  }
  return;
}

Assistant:

void torrent::lsd_announce()
	{
		if (m_abort) return;
		if (!m_enable_lsd) return;

		// if the files haven't been checked yet, we're
		// not ready for peers. Except, if we don't have metadata,
		// we need peers to download from
		if (!m_files_checked && valid_metadata()) return;

		if (!m_announce_to_lsd) return;

		// private torrents are never announced on LSD
		if (m_torrent_file->is_valid() && m_torrent_file->priv()) return;

#if TORRENT_USE_I2P
		// i2p torrents are also never announced on LSD
		// unless we allow mixed swarms
		if (is_i2p() && !settings().get_bool(settings_pack::allow_i2p_mixed))
			return;
#endif

		if (is_paused()) return;

		if (!m_ses.has_lsd()) return;

		// TODO: this pattern is repeated in a few places. Factor this into
		// a function and generalize the concept of a torrent having a
		// dedicated listen port
#ifdef TORRENT_SSL_PEERS
		int port = is_ssl_torrent() ? m_ses.ssl_listen_port() : m_ses.listen_port();
#else
		int port = m_ses.listen_port();
#endif

		// announce with the local discovery service
		m_torrent_file->info_hashes().for_each([&](sha1_hash const& ih, protocol_version)
		{
			m_ses.announce_lsd(ih, port);
		});
	}